

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::MemPass::IsPtr(MemPass *this,uint32_t ptrId)

{
  uint32_t uVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  Op OVar4;
  
  pDVar2 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,ptrId);
  OVar4 = pIVar3->opcode_;
  if (OVar4 != OpFunction) {
    while (OVar4 == OpCopyObject) {
      uVar1 = Instruction::GetSingleWordInOperand(pIVar3,0);
      pDVar2 = Pass::get_def_use_mgr(&this->super_Pass);
      pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
      OVar4 = pIVar3->opcode_;
    }
    if (OVar4 == OpVariable) {
      return true;
    }
    if (OVar4 - OpAccessChain < 2) {
      return true;
    }
    uVar1 = Instruction::type_id(pIVar3);
    if (uVar1 != 0) {
      pDVar2 = Pass::get_def_use_mgr(&this->super_Pass);
      pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
      return pIVar3->opcode_ == OpTypePointer;
    }
  }
  return false;
}

Assistant:

bool MemPass::IsPtr(uint32_t ptrId) {
  uint32_t varId = ptrId;
  Instruction* ptrInst = get_def_use_mgr()->GetDef(varId);
  if (ptrInst->opcode() == spv::Op::OpFunction) {
    // A function is not a pointer, but it's return type could be, which will
    // erroneously lead to this function returning true later on
    return false;
  }
  while (ptrInst->opcode() == spv::Op::OpCopyObject) {
    varId = ptrInst->GetSingleWordInOperand(kCopyObjectOperandInIdx);
    ptrInst = get_def_use_mgr()->GetDef(varId);
  }
  const spv::Op op = ptrInst->opcode();
  if (op == spv::Op::OpVariable || IsNonPtrAccessChain(op)) return true;
  const uint32_t varTypeId = ptrInst->type_id();
  if (varTypeId == 0) return false;
  const Instruction* varTypeInst = get_def_use_mgr()->GetDef(varTypeId);
  return varTypeInst->opcode() == spv::Op::OpTypePointer;
}